

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_format(lua_State *L)

{
  byte *__src;
  int arg;
  ushort *puVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  char *pcVar7;
  void *pvVar8;
  ushort **ppuVar9;
  lua_Integer lVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  lconv *plVar16;
  undefined1 *puVar17;
  byte *pbVar18;
  size_t sVar19;
  size_t sVar20;
  byte *pbVar21;
  bool bVar22;
  lua_Number lVar23;
  size_t l;
  char form [32];
  size_t sfl;
  luaL_Buffer b;
  size_t local_2098;
  int local_208c;
  char local_2088;
  undefined1 local_2087;
  byte local_2086 [30];
  lua_Number local_2068;
  size_t local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  local_208c = lua_gettop(L);
  pbVar6 = (byte *)luaL_checklstring(L,1,&local_2058);
  luaL_buffinit(L,&local_2050);
  if (0 < (long)local_2058) {
    pbVar21 = pbVar6 + local_2058;
    iVar5 = 1;
    do {
      bVar3 = *pbVar6;
      if (bVar3 == 0x25) {
        __src = pbVar6 + 1;
        if (pbVar6[1] == 0x25) {
          bVar3 = 0x25;
          if (local_2050.size <= local_2050.n) {
            luaL_prepbuffsize(&local_2050,1);
            bVar3 = *__src;
          }
          pbVar6 = pbVar6 + 2;
          local_2050.b[local_2050.n] = bVar3;
          goto LAB_0011d5fa;
        }
        pcVar7 = luaL_prepbuffsize(&local_2050,0x1ac);
        arg = iVar5 + 1;
        if (local_208c <= iVar5) {
          luaL_argerror(L,arg,"no value");
        }
        bVar3 = *__src;
        pbVar6 = __src;
        if (bVar3 == 0) {
          bVar3 = 0;
        }
        else {
          do {
            pvVar8 = memchr("-+ #0",(int)(char)bVar3,6);
            if (pvVar8 == (void *)0x0) goto LAB_0011d676;
            bVar3 = pbVar6[1];
            pbVar6 = pbVar6 + 1;
          } while (bVar3 != 0);
          bVar3 = 0;
        }
LAB_0011d676:
        if (5 < (ulong)((long)pbVar6 - (long)__src)) {
          luaL_error(L,"invalid format (repeated flags)");
          bVar3 = *pbVar6;
        }
        ppuVar9 = __ctype_b_loc();
        puVar1 = *ppuVar9;
        uVar11 = (ulong)(puVar1[bVar3] >> 0xb & 1);
        pbVar6 = pbVar6 + ((puVar1[pbVar6[uVar11]] >> 0xb & 1) != 0) + uVar11;
        bVar3 = *pbVar6;
        if (bVar3 == 0x2e) {
          bVar22 = (*(byte *)((long)puVar1 + (ulong)pbVar6[1] * 2 + 1) & 8) == 0;
          pbVar18 = pbVar6 + 2;
          if (bVar22) {
            pbVar18 = pbVar6 + 1;
          }
          pbVar6 = pbVar18 + ((puVar1[pbVar6[2 - (ulong)bVar22]] >> 0xb & 1) != 0);
          bVar3 = *pbVar6;
        }
        if ((*(byte *)((long)puVar1 + (ulong)bVar3 * 2 + 1) & 8) != 0) {
          luaL_error(L,"invalid format (width or precision too long)");
        }
        local_2088 = '%';
        memcpy(&local_2087,__src,(size_t)(pbVar6 + (1 - (long)__src)));
        pbVar6[(long)(local_2086 + -(long)__src)] = 0;
        bVar3 = *pbVar6;
        if (bVar3 < 0x58) {
          if (bVar3 != 0x41) {
            if ((bVar3 != 0x45) && (bVar3 != 0x47)) goto switchD_0011d75f_caseD_62;
            goto switchD_0011d75f_caseD_65;
          }
switchD_0011d75f_caseD_61:
          addlenmod(&local_2088,"");
          lVar23 = luaL_checknumber(L,arg);
LAB_0011d81b:
          iVar5 = snprintf(pcVar7,0x1ac,&local_2088,lVar23);
        }
        else {
          switch(bVar3) {
          case 0x61:
            goto switchD_0011d75f_caseD_61;
          case 0x62:
          case 0x68:
          case 0x6a:
          case 0x6b:
          case 0x6c:
          case 0x6d:
          case 0x6e:
          case 0x70:
          case 0x72:
          case 0x74:
          case 0x76:
          case 0x77:
switchD_0011d75f_caseD_62:
            iVar5 = luaL_error(L,"invalid option \'%%%c\' to \'format\'",
                               (ulong)(uint)(int)(char)bVar3);
            return iVar5;
          case 99:
            uVar11 = luaL_checkinteger(L,arg);
            iVar5 = snprintf(pcVar7,0x1ac,&local_2088,uVar11 & 0xffffffff);
            break;
          case 0x65:
          case 0x66:
          case 0x67:
switchD_0011d75f_caseD_65:
            local_2068 = luaL_checknumber(L,arg);
            addlenmod(&local_2088,"");
            lVar23 = local_2068;
            goto LAB_0011d81b;
          case 0x71:
            uVar4 = lua_type(L,arg);
            if (uVar4 < 2) {
              iVar5 = 0;
              luaL_tolstring(L,arg,(size_t *)0x0);
              luaL_addvalue(&local_2050);
            }
            else {
              if (uVar4 == 3) {
                pcVar7 = luaL_prepbuffsize(&local_2050,0x1ac);
                iVar5 = lua_isinteger(L,arg);
                if (iVar5 == 0) {
                  lua_tonumberx(L,arg,(int *)0x0);
                  iVar5 = snprintf(pcVar7,0x1ac,"%a");
                  sVar20 = (size_t)iVar5;
                  pvVar8 = memchr(pcVar7,0x2e,sVar20);
                  if (pvVar8 == (void *)0x0) {
                    plVar16 = localeconv();
                    puVar17 = (undefined1 *)memchr(pcVar7,(int)*plVar16->decimal_point,sVar20);
                    if (puVar17 != (undefined1 *)0x0) {
                      *puVar17 = 0x2e;
                    }
                  }
                }
                else {
                  lVar10 = lua_tointegerx(L,arg,(int *)0x0);
                  iVar5 = snprintf(pcVar7,0x1ac,"%lld",lVar10);
                  sVar20 = (size_t)iVar5;
                }
                local_2050.n = local_2050.n + sVar20;
              }
              else {
                if (uVar4 != 4) {
                  luaL_argerror(L,arg,"value has no literal form");
                  goto LAB_0011db90;
                }
                pcVar7 = lua_tolstring(L,arg,&local_2060);
                sVar2 = local_2060;
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                uVar11 = local_2050.n + 1;
                local_2050.b[local_2050.n] = '\"';
                local_2050.n = uVar11;
                if (sVar2 != 0) {
                  sVar19 = 0;
                  do {
                    bVar3 = pcVar7[sVar19];
                    if ((((ulong)bVar3 == 10) || (bVar3 == 0x5c)) || (bVar3 == 0x22)) {
                      sVar15 = local_2050.n;
                      if (local_2050.size <= local_2050.n) {
                        luaL_prepbuffsize(&local_2050,1);
                        sVar15 = local_2050.n;
                      }
                      local_2050.n = sVar15 + 1;
                      local_2050.b[sVar15] = '\\';
                      if (local_2050.size <= local_2050.n) {
                        luaL_prepbuffsize(&local_2050,1);
                      }
                      local_2050.b[local_2050.n] = pcVar7[sVar19];
                      local_2050.n = local_2050.n + 1;
                    }
                    else if (((*ppuVar9)[bVar3] & 2) == 0) {
                      if (local_2050.size <= local_2050.n) {
                        luaL_prepbuffsize(&local_2050,1);
                        bVar3 = pcVar7[sVar19];
                      }
                      local_2050.b[local_2050.n] = bVar3;
                      local_2050.n = local_2050.n + 1;
                    }
                    else {
                      pcVar12 = "\\%d";
                      if (((*ppuVar9)[(byte)pcVar7[sVar19 + 1]] >> 0xb & 1) != 0) {
                        pcVar12 = "\\%03d";
                      }
                      snprintf((char *)&local_2098,10,pcVar12);
                      luaL_addstring(&local_2050,(char *)&local_2098);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar2 != sVar19);
                }
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                local_2050.b[local_2050.n] = '\"';
                local_2050.n = local_2050.n + 1;
              }
LAB_0011dbed:
              iVar5 = 0;
            }
            break;
          case 0x73:
            pcVar12 = luaL_tolstring(L,arg,&local_2098);
            sVar20 = local_2098;
            if (local_2086[0] == 0) {
              luaL_addvalue(&local_2050);
LAB_0011db90:
              iVar5 = 0;
            }
            else {
              sVar13 = strlen(pcVar12);
              if (sVar20 != sVar13) {
                luaL_argerror(L,arg,"string contains zeros");
                sVar20 = local_2098;
              }
              pcVar14 = strchr(&local_2088,0x2e);
              if ((pcVar14 == (char *)0x0) && (99 < sVar20)) {
                luaL_addvalue(&local_2050);
                goto LAB_0011dbed;
              }
              iVar5 = snprintf(pcVar7,0x1ac,&local_2088,pcVar12);
              lua_settop(L,-2);
            }
            break;
          default:
            if (bVar3 != 0x58) goto switchD_0011d75f_caseD_62;
          case 100:
          case 0x69:
          case 0x6f:
          case 0x75:
          case 0x78:
            lVar10 = luaL_checkinteger(L,arg);
            addlenmod(&local_2088,"ll");
            iVar5 = snprintf(pcVar7,0x1ac,&local_2088,lVar10);
          }
        }
        pbVar6 = pbVar6 + 1;
        local_2050.n = local_2050.n + (long)iVar5;
        iVar5 = arg;
      }
      else {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
          bVar3 = *pbVar6;
        }
        pbVar6 = pbVar6 + 1;
        local_2050.b[local_2050.n] = bVar3;
LAB_0011d5fa:
        local_2050.n = local_2050.n + 1;
      }
    } while (pbVar6 < pbVar21);
  }
  luaL_pushresult(&local_2050);
  return 1;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      char *buff = luaL_prepbuffsize(&b, MAX_ITEM);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, MAX_ITEM, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, MAX_ITEM, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'e': case 'E': case 'f':
        case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'q': {
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, MAX_ITEM, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid option '%%%c' to 'format'",
                               *(strfrmt - 1));
        }
      }
      lua_assert(nb < MAX_ITEM);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}